

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::mouseMoveEvent(QGraphicsView *this,QMouseEvent *event)

{
  QGraphicsViewPrivate *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  QScrollBar *this_01;
  QScrollBar *this_02;
  QPoint QVar4;
  QPoint QVar5;
  int iVar6;
  long in_FS_OFFSET;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if ((this_00->dragMode == ScrollHandDrag) && ((this_00->field_0x301 & 2) != 0)) {
    this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    this_02 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)event);
    QVar4 = QPointF::toPoint(&local_48);
    local_58 = QSinglePointEvent::position((QSinglePointEvent *)&this_00->lastMouseEvent);
    QVar5 = QPointF::toPoint(&local_58);
    iVar6 = QVar4.xp.m_i.m_i - QVar5.xp.m_i;
    iVar2 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    bVar1 = QWidget::isRightToLeft((QWidget *)this);
    iVar3 = -iVar6;
    if (bVar1) {
      iVar3 = iVar6;
    }
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar3 + iVar2);
    iVar3 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    QAbstractSlider::setValue
              (&this_02->super_QAbstractSlider,(QVar5.yp.m_i.m_i - QVar4.yp.m_i) + iVar3);
    this_00->handScrollMotions = this_00->handScrollMotions + 1;
  }
  QGraphicsViewPrivate::mouseMoveEventHandler(this_00,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    if (d->dragMode == QGraphicsView::ScrollHandDrag) {
        if (d->handScrolling) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPoint delta = event->position().toPoint() - d->lastMouseEvent->position().toPoint();
            hBar->setValue(hBar->value() + (isRightToLeft() ? delta.x() : -delta.x()));
            vBar->setValue(vBar->value() - delta.y());

            // Detect how much we've scrolled to disambiguate scrolling from
            // clicking.
            ++d->handScrollMotions;
        }
    }

    d->mouseMoveEventHandler(event);
}